

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O3

TPZSFMatrix<long_double> * __thiscall
TPZSFMatrix<long_double>::operator-
          (TPZSFMatrix<long_double> *__return_storage_ptr__,TPZSFMatrix<long_double> *this,
          TPZSFMatrix<long_double> *A)

{
  longdouble *plVar1;
  longdouble *plVar2;
  longdouble *plVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int extraout_var_02;
  long lVar7;
  
  iVar5 = (*(A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(A);
  iVar6 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var,iVar5) != CONCAT44(extraout_var_00,iVar6)) {
    TPZMatrix<long_double>::Error
              ("TPZSFMatrix<TVar> TPZSFMatrix<long double>::operator-(const TPZSFMatrix<TVar> &) const [TVar = long double]"
               ,"Operator- <matrixs with different dimensions>");
  }
  iVar5 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  TPZSFMatrix(__return_storage_ptr__,CONCAT44(extraout_var_01,iVar5));
  plVar1 = this->fElem;
  plVar2 = A->fElem;
  plVar3 = __return_storage_ptr__->fElem;
  iVar5 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x4b])(this);
  if (CONCAT44(extraout_var_02,iVar5) != 0 && -1 < extraout_var_02) {
    lVar7 = 0;
    do {
      *(longdouble *)((long)plVar3 + lVar7) =
           *(longdouble *)((long)plVar1 + lVar7) - *(longdouble *)((long)plVar2 + lVar7);
      lVar4 = lVar7 + 0x10;
      lVar7 = lVar7 + 0x10;
    } while ((longdouble *)((long)plVar3 + lVar4) < plVar3 + CONCAT44(extraout_var_02,iVar5));
  }
  return __return_storage_ptr__;
}

Assistant:

TPZSFMatrix<TVar> 
TPZSFMatrix<TVar> ::operator-(const TPZSFMatrix<TVar>  &A ) const
{
	if ( A.Dim() != this->Dim() )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Operator- <matrixs with different dimensions>" );
	
	TPZSFMatrix<TVar>  res( this->Dim() );
	TVar *pm  = fElem;
	TVar *pa  = A.fElem;
	TVar *pr  = res.fElem;
	TVar *end = &(res.fElem[Size()]);
	
	while ( pr < end )
		*pr++ = (*pm++) - (*pa++);
	
	return( res );
}